

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
          (pdqsort_detail *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> a,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c,
          anon_class_16_2_164db4ee comp)

{
  anon_class_16_2_164db4ee comp_00;
  anon_class_16_2_164db4ee comp_01;
  anon_class_16_2_164db4ee comp_02;
  HighsSymmetryDetection *pHVar1;
  
  comp_00.this = (HighsSymmetryDetection *)comp.componentData;
  comp_00.componentData = (ComponentData *)comp_00.this;
  pHVar1 = comp_00.this;
  sort2<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
            (this,a,c,comp_00);
  comp_01.this = pHVar1;
  comp_01.componentData = (ComponentData *)comp_00.this;
  sort2<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
            ((pdqsort_detail *)a._M_current,b,c,comp_01);
  comp_02.this = pHVar1;
  comp_02.componentData = (ComponentData *)comp_00.this;
  sort2<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
            (this,a,c,comp_02);
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }